

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_3,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  bool bVar1;
  int row;
  long lVar2;
  float *pfVar3;
  bool bVar4;
  Vector<float,_3> *pVVar5;
  int row_2;
  float v;
  float fVar6;
  float local_50;
  float local_4c;
  Type in1;
  Type in0;
  float local_24 [3];
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    in0.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    in0.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    in0.m_data[0] = 1.1;
    in0.m_data[1] = 0.1;
    in0.m_data[2] = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      fVar6 = 1.0;
      if (lVar2 != 0) {
        fVar6 = 0.0;
      }
      in1.m_data.m_data[0].m_data[lVar2] = fVar6;
      fVar6 = 1.0;
      if (lVar2 != 1) {
        fVar6 = 0.0;
      }
      (&in0)[-1].m_data[lVar2] = fVar6;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    in1.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    in1.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    in1.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    in1.m_data.m_data[0].m_data[2] = 0.0;
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    in1.m_data.m_data[1].m_data[2] = 0.0;
    lVar2 = 0;
    do {
      fVar6 = (float)(&DAT_00b1f8cc)[lVar2 * 2];
      in1.m_data.m_data[0].m_data[lVar2] = (float)(&DAT_00b1f8c8)[lVar2 * 2];
      (&in0)[-1].m_data[lVar2] = fVar6;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  pfVar3 = &local_4c;
  pVVar5 = (Vector<float,_3> *)&in1;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    fVar6 = 0.0;
    lVar2 = 0;
    do {
      fVar6 = fVar6 + pVVar5->m_data[lVar2] * in0.m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    *pfVar3 = fVar6;
    pfVar3 = &local_50;
    pVVar5 = in1.m_data.m_data + 1;
    bVar1 = false;
  } while (bVar4);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar2]] = in0.m_data[lVar2 + 1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}